

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

VP8LHistogram * VP8LAllocateHistogram(int cache_bits)

{
  int iVar1;
  VP8LHistogram *pVVar2;
  
  iVar1 = (4 << ((byte)cache_bits & 0x1f)) + 0x1150;
  if (cache_bits < 1) {
    iVar1 = 0x1150;
  }
  pVVar2 = (VP8LHistogram *)WebPSafeMalloc((long)iVar1,1);
  if (pVVar2 == (VP8LHistogram *)0x0) {
    pVVar2 = (VP8LHistogram *)0x0;
  }
  else {
    pVVar2->literal = (uint32_t *)(pVVar2 + 1);
    pVVar2->palette_code_bits = cache_bits;
    pVVar2->trivial_symbol[0] = 0xffff;
    pVVar2->trivial_symbol[1] = 0xffff;
    pVVar2->trivial_symbol[2] = 0xffff;
    pVVar2->trivial_symbol[3] = 0xffff;
    pVVar2->trivial_symbol[4] = 0xffff;
    builtin_memcpy(pVVar2->is_used,"\x01\x01\x01\x01\x01",5);
    pVVar2->bit_cost = 0;
    pVVar2->costs[0] = 0;
    pVVar2->costs[1] = 0;
    pVVar2->costs[2] = 0;
    pVVar2->costs[3] = 0;
    pVVar2->costs[4] = 0;
  }
  return pVVar2;
}

Assistant:

VP8LHistogram* VP8LAllocateHistogram(int cache_bits) {
  VP8LHistogram* histo = NULL;
  const int total_size = GetHistogramSize(cache_bits);
  uint8_t* const memory = (uint8_t*)WebPSafeMalloc(total_size, sizeof(*memory));
  if (memory == NULL) return NULL;
  histo = (VP8LHistogram*)memory;
  // 'literal' won't necessary be aligned.
  histo->literal = (uint32_t*)(memory + sizeof(VP8LHistogram));
  VP8LHistogramInit(histo, cache_bits, /*init_arrays=*/ 0);
  return histo;
}